

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  string *psVar8;
  ulong uVar9;
  ostream *poVar10;
  const_iterator begin;
  size_type sVar11;
  reference pvVar12;
  char *pcVar13;
  reference pCVar14;
  char *local_ae0;
  ConfigFileInfo *i;
  iterator __end1;
  iterator __begin1;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *__range1;
  char *sep;
  string consideredVersions;
  string consideredConfigFiles;
  string consideredVersionsVar;
  string consideredConfigsVar;
  string fileVar;
  undefined1 local_750 [8];
  ostringstream aw_1;
  string local_5d8;
  string local_5b8 [32];
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  string local_500;
  string local_4e0 [8];
  string requestedVersionString;
  ConfigFileInfo *info;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  __end5;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  __begin5;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  local_498;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  *local_488;
  cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
  *__range5;
  const_iterator duplicate_end;
  ostringstream aw;
  undefined1 local_300 [8];
  ostringstream e;
  string local_180 [5];
  bool configFileSetFOUNDFalse;
  bool found;
  bool result;
  string notFoundMessage;
  string notFoundMessageVar;
  string foundVar;
  string local_118;
  undefined1 local_f8 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string dir;
  char *pcStack_68;
  bool fileFound;
  char *def;
  undefined1 local_50 [8];
  string upperFound;
  string upperDir;
  cmFindPackageCommand *this_local;
  
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::clear(&this->ConsideredConfigs);
  cmsys::SystemTools::UpperCase((string *)((long)&upperFound.field_2 + 8),&this->Name);
  cmsys::SystemTools::UpperCase((string *)local_50,&this->Name);
  std::__cxx11::string::operator+=((string *)(upperFound.field_2._M_local_buf + 8),"_DIR");
  std::__cxx11::string::operator+=((string *)local_50,"_FOUND");
  pcStack_68 = cmMakefile::GetDefinition
                         ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
  dir.field_2._M_local_buf[0xf] = '\0';
  if ((this->UseConfigFiles & 1U) != 0) {
    bVar3 = cmSystemTools::IsOff(pcStack_68);
    if (!bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,pcStack_68,&local_91);
      std::allocator<char>::~allocator(&local_91);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_90);
      bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_90);
      if (!bVar3) {
        std::operator+(&local_b8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((this->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&file.field_2 + 8),psVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=
                  ((string *)local_90,(string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)local_f8);
      bVar3 = FindConfigFile(this,(string *)local_90,(string *)local_f8);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)&this->FileFound,(string *)local_f8);
        dir.field_2._M_local_buf[0xf] = '\x01';
      }
      pcStack_68 = cmMakefile::GetDefinition
                             ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)local_90);
    }
    bVar3 = cmSystemTools::IsOff(pcStack_68);
    if ((bVar3) || ((dir.field_2._M_local_buf[0xf] & 1U) == 0)) {
      dir.field_2._M_local_buf[0xf] = FindConfig(this);
    }
    if (((dir.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"fileFound is true but FileFound is empty!",
                 (allocator<char> *)(foundVar.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)(foundVar.field_2._M_local_buf + 0xf));
      dir.field_2._M_local_buf[0xf] = '\0';
    }
  }
  std::__cxx11::string::string
            ((string *)(notFoundMessageVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)(notFoundMessageVar.field_2._M_local_buf + 8),"_FOUND")
  ;
  std::__cxx11::string::string
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),"_NOT_FOUND_MESSAGE");
  std::__cxx11::string::string(local_180);
  bVar3 = true;
  bVar7 = false;
  bVar5 = false;
  if ((dir.field_2._M_local_buf[0xf] & 1U) != 0) {
    bVar4 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,
                       (string *)((long)&notFoundMessageVar.field_2 + 8));
    if ((bVar4) &&
       (bVar4 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar4)) {
      cmMakefile::RemoveDefinition
                ((this->super_cmFindCommon).super_cmCommand.Makefile,
                 (string *)((long)&notFoundMessageVar.field_2 + 8));
    }
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&notFoundMessage.field_2 + 8));
    StoreVersionFound(this);
    bVar4 = ReadListFile(this,&this->FileFound,DoPolicyScope);
    if (bVar4) {
      bVar7 = true;
      bVar4 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,
                         (string *)((long)&notFoundMessageVar.field_2 + 8));
      if ((bVar4) &&
         (bVar4 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                   (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar4)) {
        bVar7 = false;
        bVar5 = true;
        psVar8 = cmMakefile::GetSafeDefinition
                           ((this->super_cmFindCommon).super_cmCommand.Makefile,
                            (string *)((long)&notFoundMessage.field_2 + 8));
        std::__cxx11::string::operator=(local_180,(string *)psVar8);
      }
    }
    else {
      bVar3 = false;
    }
  }
  cVar2.End._M_current = local_498.End._M_current;
  cVar2.Begin._M_current = local_498.Begin._M_current;
  if ((bVar3 != false) && (local_498 = cVar2, !bVar7)) {
    if (((this->Required & 1U) == 0) &&
       (((this->Quiet & 1U) != 0 ||
        ((((this->UseConfigFiles & 1U) != 0 && ((this->UseFindModules & 1U) == 0)) &&
         (bVar4 = std::
                  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  ::empty(&this->ConsideredConfigs), bVar4)))))) {
      if ((this->Quiet & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_750);
        poVar10 = std::operator<<((ostream *)local_750,"Could NOT find ");
        poVar10 = std::operator<<(poVar10,(string *)&this->Name);
        poVar10 = std::operator<<(poVar10," (missing: ");
        poVar10 = std::operator<<(poVar10,(string *)&this->Name);
        std::operator<<(poVar10,"_DIR)");
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::DisplayStatus(pcVar1,(string *)((long)&fileVar.field_2 + 8),-1.0);
        std::__cxx11::string::~string((string *)(fileVar.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_750);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&duplicate_end);
      if (bVar5) {
        poVar10 = std::operator<<((ostream *)local_300,"Found package configuration file:\n  ");
        poVar10 = std::operator<<(poVar10,(string *)&this->FileFound);
        poVar10 = std::operator<<(poVar10,"\nbut it set ");
        poVar10 = std::operator<<(poVar10,(string *)(notFoundMessageVar.field_2._M_local_buf + 8));
        poVar10 = std::operator<<(poVar10," to FALSE so package \"");
        poVar10 = std::operator<<(poVar10,(string *)&this->Name);
        std::operator<<(poVar10,"\" is considered to be NOT FOUND.");
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          poVar10 = std::operator<<((ostream *)local_300," Reason given by package: \n");
          poVar10 = std::operator<<(poVar10,local_180);
          std::operator<<(poVar10,"\n");
        }
      }
      else {
        bVar5 = std::
                vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                ::empty(&this->ConsideredConfigs);
        if (bVar5) {
          std::__cxx11::string::string(local_4e0);
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            std::__cxx11::string::operator=(local_4e0," (requested version ");
            std::__cxx11::string::operator+=(local_4e0,(string *)&this->Version);
            std::__cxx11::string::operator+=(local_4e0,")");
          }
          if ((this->UseConfigFiles & 1U) == 0) {
            poVar10 = std::operator<<((ostream *)local_300,"No \"Find");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            poVar10 = std::operator<<(poVar10,".cmake\" found in ");
            std::operator<<(poVar10,"CMAKE_MODULE_PATH.");
            poVar10 = std::operator<<((ostream *)&duplicate_end,"Find");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            poVar10 = std::operator<<(poVar10,
                                      ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                                     );
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            std::operator<<(poVar10,
                            ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
                           );
          }
          else {
            if ((this->UseFindModules & 1U) != 0) {
              poVar10 = std::operator<<((ostream *)local_300,"By not providing \"Find");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,
                                        ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                                       );
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              std::operator<<(poVar10,"\", but CMake did not find one.\n");
            }
            sVar11 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&this->Configs);
            if (sVar11 == 1) {
              poVar10 = std::operator<<((ostream *)local_300,
                                        "Could not find a package configuration file named \"");
              pvVar12 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&this->Configs,0);
              poVar10 = std::operator<<(poVar10,(string *)pvVar12);
              poVar10 = std::operator<<(poVar10,"\" provided by package \"");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,"\"");
              poVar10 = std::operator<<(poVar10,local_4e0);
              std::operator<<(poVar10,".\n");
            }
            else {
              poVar10 = std::operator<<((ostream *)local_300,
                                        "Could not find a package configuration file provided by \""
                                       );
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,"\"");
              poVar10 = std::operator<<(poVar10,local_4e0);
              poVar10 = std::operator<<(poVar10," with any of the following names:\n");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_520,"  ",&local_521);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"",&local_549)
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_570,"\n",&local_571);
              cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_500,&local_520,&this->Configs,&local_548,&local_570);
              poVar10 = std::operator<<(poVar10,(string *)&local_500);
              std::operator<<(poVar10,"\n");
              std::__cxx11::string::~string((string *)&local_500);
              std::__cxx11::string::~string((string *)&local_570);
              std::allocator<char>::~allocator(&local_571);
              std::__cxx11::string::~string((string *)&local_548);
              std::allocator<char>::~allocator(&local_549);
              std::__cxx11::string::~string((string *)&local_520);
              std::allocator<char>::~allocator(&local_521);
            }
            poVar10 = std::operator<<((ostream *)local_300,"Add the installation prefix of \"");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            poVar10 = std::operator<<(poVar10,"\" to CMAKE_PREFIX_PATH or set \"");
            poVar10 = std::operator<<(poVar10,(string *)&this->Variable);
            poVar10 = std::operator<<(poVar10,
                                      "\" to a directory containing one of the above files. If \"");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            std::operator<<(poVar10,
                            "\" provides a separate development package or SDK, be sure it has been installed."
                           );
          }
          std::__cxx11::string::~string(local_4e0);
        }
        else {
          __range5 = (cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
                      *)cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
                                  (&this->ConsideredConfigs);
          poVar10 = std::operator<<((ostream *)local_300,
                                    "Could not find a configuration file for package \"");
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          poVar10 = std::operator<<(poVar10,"\" that ");
          pcVar13 = "is compatible with";
          if ((this->VersionExact & 1U) != 0) {
            pcVar13 = "exactly matches";
          }
          poVar10 = std::operator<<(poVar10,pcVar13);
          poVar10 = std::operator<<(poVar10," requested version \"");
          poVar10 = std::operator<<(poVar10,(string *)&this->Version);
          poVar10 = std::operator<<(poVar10,"\".\n");
          std::operator<<(poVar10,
                          "The following configuration files were considered but not accepted:\n");
          begin = std::
                  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  ::cbegin(&this->ConsideredConfigs);
          local_498 = cmMakeRange<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>
                                ((__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                  )begin._M_current,
                                 (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                  )__range5);
          local_488 = &local_498;
          __end5 = cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
                   ::begin(local_488);
          info = (ConfigFileInfo *)
                 cmRange<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>
                 ::end(local_488);
          while( true ) {
            bVar5 = __gnu_cxx::operator!=
                              (&__end5,(__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                        *)&info);
            if (!bVar5) break;
            requestedVersionString.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                 ::operator*(&__end5);
            poVar10 = std::operator<<((ostream *)local_300,"  ");
            poVar10 = std::operator<<(poVar10,(string *)requestedVersionString.field_2._8_8_);
            poVar10 = std::operator<<(poVar10,", version: ");
            poVar10 = std::operator<<(poVar10,(string *)
                                              (requestedVersionString.field_2._8_8_ + 0x20));
            std::operator<<(poVar10,"\n");
            __gnu_cxx::
            __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
            ::operator++(&__end5);
          }
        }
      }
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      bVar5 = this->Required;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,((byte)~bVar5 & 1) * 3 + FATAL_ERROR,&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      if ((this->Required & 1U) != 0) {
        cmSystemTools::SetFatalErrorOccured();
      }
      std::__cxx11::ostringstream::str();
      bVar6 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_5b8);
      if (((bVar6 ^ 0xff) & 1) != 0) {
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_5d8);
        std::__cxx11::string::~string((string *)&local_5d8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&duplicate_end);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
    }
  }
  if (bVar7) {
    local_ae0 = "1";
  }
  else {
    local_ae0 = "0";
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,
             (string *)((long)&notFoundMessageVar.field_2 + 8),local_ae0);
  std::__cxx11::string::string
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),"_CONFIG");
  if (bVar7) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    pcVar13 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigsVar.field_2 + 8),pcVar13);
  }
  else {
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&consideredConfigsVar.field_2 + 8));
  }
  std::__cxx11::string::string
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),"_CONSIDERED_CONFIGS");
  std::__cxx11::string::string
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),"_CONSIDERED_VERSIONS");
  std::__cxx11::string::string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&sep);
  __range1 = (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              *)0x76e680;
  __end1 = std::
           vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ::begin(&this->ConsideredConfigs);
  i = (ConfigFileInfo *)
      std::
      vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
      ::end(&this->ConsideredConfigs);
  while( true ) {
    bVar7 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                                *)&i);
    if (!bVar7) break;
    pCVar14 = __gnu_cxx::
              __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
              ::operator*(&__end1);
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(char *)__range1);
    std::__cxx11::string::operator+=((string *)&sep,(char *)__range1);
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(string *)pCVar14);
    std::__cxx11::string::operator+=((string *)&sep,(string *)&pCVar14->version);
    __range1 = (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                *)0x75e1fb;
    __gnu_cxx::
    __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
    ::operator++(&__end1);
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar13 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredVersionsVar.field_2 + 8),pcVar13);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar13 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigFiles.field_2 + 8),pcVar13);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigFiles.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredVersionsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string((string *)(notFoundMessage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(notFoundMessageVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(upperFound.field_2._M_local_buf + 8));
  return bVar3;
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles) {
    if (!cmSystemTools::IsOff(def)) {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if (!cmSystemTools::FileIsFullPath(dir)) {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
      }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file)) {
        this->FileFound = file;
        fileFound = true;
      }
      def = this->Makefile->GetDefinition(this->Variable);
    }

    // Search for the config file if it is not already found.
    if (cmSystemTools::IsOff(def) || !fileFound) {
      fileFound = this->FindConfig();
    }

    // Sanity check.
    if (fileFound && this->FileFound.empty()) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "fileFound is true but FileFound is empty!");
      fileFound = false;
    }
  }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if (fileFound) {
    if (this->Makefile->IsDefinitionSet(foundVar) &&
        !this->Makefile->IsOn(foundVar)) {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
    }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if (this->ReadListFile(this->FileFound, DoPolicyScope)) {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage =
          this->Makefile->GetSafeDefinition(notFoundMessageVar);
      }
    } else {
      // The configuration file is invalid.
      result = false;
    }
  }

  // package not found
  if (result && !found) {
    // warn if package required or neither quiet nor in config mode
    if (this->Required ||
        !(this->Quiet ||
          (this->UseConfigFiles && !this->UseFindModules &&
           this->ConsideredConfigs.empty()))) {
      // The variable is not set.
      std::ostringstream e;
      std::ostringstream aw;
      if (configFileSetFOUNDFalse) {
        /* clang-format off */
        e << "Found package configuration file:\n"
          "  " << this->FileFound << "\n"
          "but it set " << foundVar << " to FALSE so package \"" <<
          this->Name << "\" is considered to be NOT FOUND.";
        /* clang-format on */
        if (!notFoundMessage.empty()) {
          e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
      // If there are files in ConsideredConfigs, it means that FooConfig.cmake
      // have been found, but they didn't have appropriate versions.
      else if (!this->ConsideredConfigs.empty()) {
        std::vector<ConfigFileInfo>::const_iterator duplicate_end =
          cmRemoveDuplicates(this->ConsideredConfigs);
        e << "Could not find a configuration file for package \"" << this->Name
          << "\" that "
          << (this->VersionExact ? "exactly matches" : "is compatible with")
          << " requested version \"" << this->Version << "\".\n"
          << "The following configuration files were considered but not "
             "accepted:\n";

        for (ConfigFileInfo const& info :
             cmMakeRange(this->ConsideredConfigs.cbegin(), duplicate_end)) {
          e << "  " << info.filename << ", version: " << info.version << "\n";
        }
      } else {
        std::string requestedVersionString;
        if (!this->Version.empty()) {
          requestedVersionString = " (requested version ";
          requestedVersionString += this->Version;
          requestedVersionString += ")";
        }

        if (this->UseConfigFiles) {
          if (this->UseFindModules) {
            e << "By not providing \"Find" << this->Name
              << ".cmake\" in "
                 "CMAKE_MODULE_PATH this project has asked CMake to find a "
                 "package configuration file provided by \""
              << this->Name
              << "\", "
                 "but CMake did not find one.\n";
          }

          if (this->Configs.size() == 1) {
            e << "Could not find a package configuration file named \""
              << this->Configs[0] << "\" provided by package \"" << this->Name
              << "\"" << requestedVersionString << ".\n";
          } else {
            e << "Could not find a package configuration file provided by \""
              << this->Name << "\"" << requestedVersionString
              << " with any of the following names:\n"
              << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

          e << "Add the installation prefix of \"" << this->Name
            << "\" to "
               "CMAKE_PREFIX_PATH or set \""
            << this->Variable
            << "\" to a "
               "directory containing one of the above files. "
               "If \""
            << this->Name
            << "\" provides a separate development "
               "package or SDK, be sure it has been installed.";
        } else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
          e << "No \"Find" << this->Name << ".cmake\" found in "
            << "CMAKE_MODULE_PATH.";

          aw
            << "Find" << this->Name
            << ".cmake must either be part of this "
               "project itself, in this case adjust CMAKE_MODULE_PATH so that "
               "it points to the correct location inside its source tree.\n"
               "Or it must be installed by a package which has already been "
               "found via find_package().  In this case make sure that "
               "package has indeed been found and adjust CMAKE_MODULE_PATH to "
               "contain the location where that package has installed "
               "Find"
            << this->Name
            << ".cmake.  This must be a location "
               "provided by that package.  This error in general means that "
               "the buildsystem of this project is relying on a Find-module "
               "without ensuring that it is actually available.\n";
        }
      }

      this->Makefile->IssueMessage(this->Required ? MessageType::FATAL_ERROR
                                                  : MessageType::WARNING,
                                   e.str());
      if (this->Required) {
        cmSystemTools::SetFatalErrorOccured();
      }

      if (!aw.str().empty()) {
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, aw.str());
      }
    }
    // output result if in config mode but not in quiet mode
    else if (!this->Quiet) {
      std::ostringstream aw;
      aw << "Could NOT find " << this->Name << " (missing: " << this->Name
         << "_DIR)";
      this->Makefile->DisplayStatus(aw.str(), -1);
    }
  }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found ? "1" : "0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if (found) {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
  } else {
    this->Makefile->RemoveDefinition(fileVar);
  }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for (ConfigFileInfo const& i : this->ConsideredConfigs) {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += i.filename;
    consideredVersions += i.version;
    sep = ";";
  }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}